

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blendshape.hpp
# Opt level: O2

vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_> *
eos::morphablemodel::load_blendshapes
          (vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
           *__return_storage_ptr__,string *filename)

{
  runtime_error *this;
  BinaryInputArchive input_archive;
  ifstream file;
  byte abStack_208 [488];
  
  (__return_storage_ptr__->
  super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&file,(string *)filename,_S_bin);
  if ((abStack_208[*(long *)(_file + -0x18)] & 5) == 0) {
    cereal::BinaryInputArchive::BinaryInputArchive(&input_archive,(istream *)&file);
    cereal::InputArchive<cereal::BinaryInputArchive,1u>::operator()
              ((InputArchive<cereal::BinaryInputArchive,1u> *)&input_archive,__return_storage_ptr__)
    ;
    cereal::InputArchive<cereal::BinaryInputArchive,_1U>::~InputArchive
              (&input_archive.super_InputArchive<cereal::BinaryInputArchive,_1U>);
    std::ifstream::~ifstream(&file);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input_archive
                 ,"Error opening given file: ",filename);
  std::runtime_error::runtime_error(this,(string *)&input_archive);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline std::vector<Blendshape> load_blendshapes(std::string filename)
{
    std::vector<Blendshape> blendshapes;

    std::ifstream file(filename, std::ios::binary);
    if (!file)
    {
        throw std::runtime_error("Error opening given file: " + filename);
    }
    cereal::BinaryInputArchive input_archive(file);
    input_archive(blendshapes);

    return blendshapes;
}